

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int uv_sem_trywait(uv_sem_t *sem)

{
  uv_mutex_t *mutex;
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if (platform_needs_custom_semaphore == 0) {
    do {
      iVar2 = sem_trywait((sem_t *)sem);
      if (iVar2 != -1) {
        if (iVar2 == 0) {
          return 0;
        }
        break;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    piVar3 = __errno_location();
    iVar2 = -0xb;
    if (*piVar3 != 0xb) goto LAB_00188cfb;
  }
  else {
    mutex = *(uv_mutex_t **)sem;
    iVar1 = uv_mutex_trylock(mutex);
    iVar2 = -0xb;
    if (iVar1 == 0) {
      if (*(int *)((long)mutex + 0x58) == 0) {
        iVar1 = pthread_mutex_unlock((pthread_mutex_t *)mutex);
        if (iVar1 != 0) goto LAB_00188cfb;
      }
      else {
        *(int *)((long)mutex + 0x58) = *(int *)((long)mutex + 0x58) + -1;
        iVar2 = pthread_mutex_unlock((pthread_mutex_t *)mutex);
        if (iVar2 != 0) {
LAB_00188cfb:
          abort();
        }
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int uv_sem_trywait(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    return uv__custom_sem_trywait(sem);
  else
    return uv__sem_trywait(sem);
}